

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_diff.hpp
# Opt level: O2

Diffs * __thiscall
MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
diff_bisect(Diffs *__return_storage_ptr__,
           MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,Range text1,Range text2,Time deadline)

{
  long lVar1;
  int x;
  int iVar2;
  Range text2_00;
  Range text2_01;
  Range text1_00;
  Range text1_01;
  Char CVar3;
  Char CVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  Size idx;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  Size idx_00;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int local_138;
  int local_134;
  Range text2_local;
  Range text1_local;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  Diff local_48;
  
  text2_local.till = text2.till._M_current;
  text2_local.from = text2.from._M_current;
  text1_local.till = text1.till._M_current;
  text1_local.from = text1.from._M_current;
  iVar5 = (int)text1.till._M_current - (uint)text1.from._M_current;
  iVar10 = (int)text2.till._M_current - (uint)text2.from._M_current;
  uVar18 = (long)(iVar5 + iVar10 + 1) / 2;
  iVar2 = (int)uVar18;
  uVar6 = iVar2 * 2;
  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&v1,(long)(int)uVar6);
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&v2,(long)(int)uVar6);
  uVar15 = 0;
  uVar16 = 0;
  if (0 < (int)uVar6) {
    uVar16 = (ulong)uVar6;
  }
  for (; uVar16 != uVar15; uVar15 = uVar15 + 1) {
    v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar15] = -1;
    v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar15] = -1;
  }
  lVar13 = (long)iVar2;
  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [lVar13 + 1] = 0;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [lVar13 + 1] = 0;
  uVar14 = iVar5 - iVar10;
  uVar16 = 0;
  uVar15 = 0;
  if (0 < iVar2) {
    uVar15 = uVar18 & 0xffffffff;
  }
  iVar9 = 0;
  local_138 = 0;
  iVar8 = 0;
  local_134 = 0;
  iVar7 = 0;
  do {
    if (uVar16 == uVar15) {
      (__return_storage_ptr__->
      super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.operation = DELETE;
      local_48.text.from._M_current = text1_local.from._M_current;
      local_48.text.till._M_current = text1_local.till._M_current;
      std::
      vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
      ::emplace_back<MyersDiff<std::__cxx11::string>::Diff>
                ((vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
                  *)__return_storage_ptr__,&local_48);
      local_48.operation = INSERT;
      local_48.text.from._M_current = text2_local.from._M_current;
      local_48.text.till._M_current = text2_local.till._M_current;
      std::
      vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
      ::emplace_back<MyersDiff<std::__cxx11::string>::Diff>
                ((vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
                  *)__return_storage_ptr__,&local_48);
LAB_00102320:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&v2.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&v1.super__Vector_base<int,_std::allocator<int>_>);
      return __return_storage_ptr__;
    }
    iVar17 = (int)uVar16 - iVar7;
    for (uVar18 = (ulong)(iVar9 + iVar7); (long)uVar18 <= (long)(uVar16 - (long)local_134);
        uVar18 = uVar18 + 2) {
      lVar1 = uVar18 + lVar13;
      if (uVar18 == -uVar16) {
        iVar11 = v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[lVar1 + 1];
      }
      else if ((uVar18 == uVar16) ||
              (iVar11 = v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar1 + 1],
              iVar11 <= v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar1 + -1])) {
        iVar11 = v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[lVar1 + -1] + 1;
      }
      idx = (Size)iVar11;
      for (idx_00 = (Size)(iVar11 + iVar17);
          ((long)idx < (long)iVar5 && ((long)idx_00 < (long)iVar10)); idx_00 = idx_00 + 1) {
        CVar3 = Range::operator[](&text1_local,idx);
        CVar4 = Range::operator[](&text2_local,idx_00);
        if (CVar3 != CVar4) break;
        idx = idx + 1;
      }
      iVar11 = (int)idx;
      v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar1] = iVar11;
      if (iVar5 < iVar11) {
        local_134 = local_134 + 2;
      }
      else if (iVar10 < iVar11 + iVar17) {
        iVar7 = iVar7 + 2;
      }
      else if (((((uVar14 & 1) != 0) &&
                (uVar12 = (uVar14 + iVar2) - (int)uVar18,
                (int)uVar12 < (int)uVar6 && -1 < (int)uVar12)) &&
               (v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar12] != -1)) &&
              (iVar5 - v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12] <= iVar11)) {
        text1_00.till._M_current = text1_local.till._M_current;
        text1_00.from._M_current = text1_local.from._M_current;
        text2_00.till._M_current = text2_local.till._M_current;
        text2_00.from._M_current = text2_local.from._M_current;
        diff_bisectSplit(__return_storage_ptr__,this,text1_00,text2_00,iVar11,iVar11 + iVar17,
                         deadline);
        goto LAB_00102320;
      }
      iVar17 = iVar17 + -2;
    }
    iVar17 = (int)uVar16 - iVar8;
    for (uVar18 = (ulong)(iVar9 + iVar8); (long)uVar18 <= (long)(uVar16 - (long)local_138);
        uVar18 = uVar18 + 2) {
      lVar1 = uVar18 + lVar13;
      if (uVar18 == -uVar16) {
        iVar11 = v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[lVar1 + 1];
      }
      else if ((uVar18 == uVar16) ||
              (iVar11 = v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar1 + 1],
              iVar11 <= v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar1 + -1])) {
        iVar11 = v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[lVar1 + -1] + 1;
      }
      lVar22 = (long)iVar11;
      lVar21 = (ulong)((~(uint)text2.from._M_current + (int)text2.till._M_current) -
                      (iVar11 + iVar17)) << 0x20;
      lVar20 = (ulong)((~(uint)text1.from._M_current + (int)text1.till._M_current) - iVar11) << 0x20
      ;
      for (lVar19 = (long)(iVar11 + iVar17); (lVar22 < iVar5 && (lVar19 < iVar10));
          lVar19 = lVar19 + 1) {
        CVar3 = Range::operator[](&text1_local,lVar20 >> 0x20);
        CVar4 = Range::operator[](&text2_local,lVar21 >> 0x20);
        if (CVar3 != CVar4) break;
        lVar22 = lVar22 + 1;
        lVar21 = lVar21 + -0x100000000;
        lVar20 = lVar20 + -0x100000000;
      }
      iVar11 = (int)lVar22;
      v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar1] = iVar11;
      if (iVar5 < iVar11) {
        local_138 = local_138 + 2;
      }
      else if (iVar10 < iVar11 - (int)uVar18) {
        iVar8 = iVar8 + 2;
      }
      else if (((uVar14 & 1) == 0) &&
              (uVar12 = (uVar14 + iVar2) - (int)uVar18, (int)uVar12 < (int)uVar6 && -1 < (int)uVar12
              )) {
        x = v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar12];
        if ((x != -1) && (iVar5 - iVar11 <= x)) {
          text1_01.till._M_current = text1_local.till._M_current;
          text1_01.from._M_current = text1_local.from._M_current;
          text2_01.till._M_current = text2_local.till._M_current;
          text2_01.from._M_current = text2_local.from._M_current;
          diff_bisectSplit(__return_storage_ptr__,this,text1_01,text2_01,x,(iVar2 - uVar12) + x,
                           deadline);
          goto LAB_00102320;
        }
      }
      iVar17 = iVar17 + -2;
    }
    uVar16 = uVar16 + 1;
    iVar9 = iVar9 + -1;
  } while( true );
}

Assistant:

Diffs diff_bisect(Range text1, Range text2, Time deadline) {
        // Cache the text lengths to prevent multiple calls.
        int text1_length = text1.size();
        int text2_length = text2.size();
        int max_d = (text1_length + text2_length + 1) / 2;
        int v_offset = max_d;
        int v_length = 2 * max_d;
        vector<int> v1;
        v1.resize(v_length);
        vector<int> v2;
        v2.resize(v_length);
        for (int x = 0; x < v_length; x++) {
            v1[x] = -1;
            v2[x] = -1;
        }
        v1[v_offset + 1] = 0;
        v2[v_offset + 1] = 0;
        int delta = text1_length - text2_length;
        // If the total number of characters is odd, then the front path will
        // collide with the reverse path.
        bool front = (delta % 2 != 0);
        // Offsets for start and end of k loop.
        // Prevents mapping of space beyond the grid.
        int k1start = 0;
        int k1end = 0;
        int k2start = 0;
        int k2end = 0;
        for (int d = 0; d < max_d; d++) {
            // Bail out if deadline is reached.
            /* TODO if (System.currentTimeMillis() > deadline) {
              break;
            } */

            // Walk the front path one step.
            for (int k1 = -d + k1start; k1 <= d - k1end; k1 += 2) {
                int k1_offset = v_offset + k1;
                int x1;
                if (k1 == -d ||
                    (k1 != d && v1[k1_offset - 1] < v1[k1_offset + 1])) {
                    x1 = v1[k1_offset + 1];
                } else {
                    x1 = v1[k1_offset - 1] + 1;
                }
                int y1 = x1 - k1;
                while (x1 < text1_length && y1 < text2_length &&
                       text1[x1] == text2[y1]) {
                    x1++;
                    y1++;
                }
                v1[k1_offset] = x1;
                if (x1 > text1_length) {
                    // Ran off the right of the graph.
                    k1end += 2;
                } else if (y1 > text2_length) {
                    // Ran off the bottom of the graph.
                    k1start += 2;
                } else if (front) {
                    int k2_offset = v_offset + delta - k1;
                    if (k2_offset >= 0 && k2_offset < v_length &&
                        v2[k2_offset] != -1) {
                        // Mirror x2 onto top-left coordinate system.
                        int x2 = text1_length - v2[k2_offset];
                        if (x1 >= x2) {
                            // Overlap detected.
                            return diff_bisectSplit(text1, text2, x1, y1,
                                                    deadline);
                        }
                    }
                }
            }

            // Walk the reverse path one step.
            for (int k2 = -d + k2start; k2 <= d - k2end; k2 += 2) {
                int k2_offset = v_offset + k2;
                int x2;
                if (k2 == -d ||
                    (k2 != d && v2[k2_offset - 1] < v2[k2_offset + 1])) {
                    x2 = v2[k2_offset + 1];
                } else {
                    x2 = v2[k2_offset - 1] + 1;
                }
                int y2 = x2 - k2;
                while (x2 < text1_length && y2 < text2_length &&
                       text1[text1_length - x2 - 1] ==
                           text2[text2_length - y2 - 1]) {
                    x2++;
                    y2++;
                }
                v2[k2_offset] = x2;
                if (x2 > text1_length) {
                    // Ran off the left of the graph.
                    k2end += 2;
                } else if (y2 > text2_length) {
                    // Ran off the top of the graph.
                    k2start += 2;
                } else if (!front) {
                    int k1_offset = v_offset + delta - k2;
                    if (k1_offset >= 0 && k1_offset < v_length &&
                        v1[k1_offset] != -1) {
                        int x1 = v1[k1_offset];
                        int y1 = v_offset + x1 - k1_offset;
                        // Mirror x2 onto top-left coordinate system.
                        x2 = text1_length - x2;
                        if (x1 >= x2) {
                            // Overlap detected.
                            return diff_bisectSplit(text1, text2, x1, y1,
                                                    deadline);
                        }
                    }
                }
            }
        }
        // Diff took too long and hit the deadline or
        // number of diffs equals number of characters, no commonality at all.
        Diffs diffs{};
        diffs.push_back(Diff{DELETE, text1});
        diffs.push_back(Diff{INSERT, text2});
        return diffs;
    }